

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall higan::EventLoop::EventLoop(EventLoop *this)

{
  _Head_base<0UL,_higan::MultiplexBase_*,_false> this_00;
  allocator_type local_31;
  
  this_00._M_head_impl = (MultiplexBase *)operator_new(0x40);
  MultiplexEpoll::MultiplexEpoll((MultiplexEpoll *)this_00._M_head_impl);
  (this->multiplex_base_)._M_t.
  super___uniq_ptr_impl<higan::MultiplexBase,_std::default_delete<higan::MultiplexBase>_>._M_t.
  super__Tuple_impl<0UL,_higan::MultiplexBase_*,_std::default_delete<higan::MultiplexBase>_>.
  super__Head_base<0UL,_higan::MultiplexBase_*,_false>._M_head_impl = this_00._M_head_impl;
  std::vector<higan::Channel_*,_std::allocator<higan::Channel_*>_>::vector
            (&this->active_channel_list_,100,&local_31);
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->pending_func_queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
           _M_impl.super__Vector_impl_data._M_finish + 3) = 0;
  *(undefined8 *)
   ((long)&(this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 3) = 0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )&this->pending_func_queue_,0);
  Mutex::Mutex(&this->mutex_);
  TimerManager::TimerManager(&this->timer_manager_);
  return;
}

Assistant:

EventLoop::EventLoop():
		multiplex_base_(new MultiplexEpoll()),
		active_channel_list_(MultiplexEpoll::EPOLL_MAX_EVNETS),
		timeout_timers_(),
		handling_pending_event_(false),
		looping_(false),
		quit_(false),
		mutex_(),
		timer_manager_()
{

}